

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

int Abc_Tt6CofactorPermNaive(word *pTruth,int i,int fSwapOnly)

{
  ulong uVar1;
  word wVar2;
  uint local_3c;
  ulong uStack_38;
  int Config;
  word Best;
  word Copy_1;
  word Copy;
  int fSwapOnly_local;
  int i_local;
  word *pTruth_local;
  
  if (fSwapOnly == 0) {
    uVar1 = *pTruth;
    wVar2 = Abc_Tt6Flip(*pTruth,i);
    uStack_38 = uVar1;
    if (wVar2 < uVar1) {
      uStack_38 = wVar2;
    }
    local_3c = (uint)(wVar2 < uVar1);
    wVar2 = Abc_Tt6Flip(wVar2,i + 1);
    if (wVar2 < uStack_38) {
      local_3c = 3;
      uStack_38 = wVar2;
    }
    wVar2 = Abc_Tt6Flip(wVar2,i);
    if (wVar2 < uStack_38) {
      local_3c = 2;
      uStack_38 = wVar2;
    }
    wVar2 = Abc_Tt6SwapAdjacent(wVar2,i);
    if (wVar2 < uStack_38) {
      local_3c = 6;
      uStack_38 = wVar2;
    }
    wVar2 = Abc_Tt6Flip(wVar2,i + 1);
    if (wVar2 < uStack_38) {
      local_3c = 7;
      uStack_38 = wVar2;
    }
    wVar2 = Abc_Tt6Flip(wVar2,i);
    if (wVar2 < uStack_38) {
      local_3c = 5;
      uStack_38 = wVar2;
    }
    wVar2 = Abc_Tt6Flip(wVar2,i + 1);
    if (wVar2 < uStack_38) {
      local_3c = 4;
      uStack_38 = wVar2;
    }
    wVar2 = Abc_Tt6SwapAdjacent(wVar2,i);
    if (wVar2 != *pTruth) {
      __assert_fail("Copy == pTruth[0]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0x315,"int Abc_Tt6CofactorPermNaive(word *, int, int)");
    }
    if (*pTruth < uStack_38) {
      __assert_fail("Best <= pTruth[0]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0x316,"int Abc_Tt6CofactorPermNaive(word *, int, int)");
    }
    *pTruth = uStack_38;
    pTruth_local._4_4_ = local_3c;
  }
  else {
    wVar2 = Abc_Tt6SwapAdjacent(*pTruth,i);
    if (wVar2 < *pTruth) {
      *pTruth = wVar2;
      pTruth_local._4_4_ = 4;
    }
    else {
      pTruth_local._4_4_ = 0;
    }
  }
  return pTruth_local._4_4_;
}

Assistant:

int Abc_Tt6CofactorPermNaive( word * pTruth, int i, int fSwapOnly )
{
    if ( fSwapOnly )
    {
        word Copy = Abc_Tt6SwapAdjacent( pTruth[0], i );
        if ( pTruth[0] > Copy )
        {
            pTruth[0] = Copy;
            return 4;
        }
        return 0;
    }
    {
        word Copy = pTruth[0];
        word Best = pTruth[0];
        int Config = 0;
        // PXY
        // 001
        Copy = Abc_Tt6Flip( Copy, i );
        if ( Best > Copy )
            Best = Copy, Config = 1;
        // PXY
        // 011
        Copy = Abc_Tt6Flip( Copy, i+1 );
        if ( Best > Copy )
            Best = Copy, Config = 3;
        // PXY
        // 010
        Copy = Abc_Tt6Flip( Copy, i );
        if ( Best > Copy )
            Best = Copy, Config = 2;
        // PXY
        // 110
        Copy = Abc_Tt6SwapAdjacent( Copy, i );
        if ( Best > Copy )
            Best = Copy, Config = 6;
        // PXY
        // 111
        Copy = Abc_Tt6Flip( Copy, i+1 );
        if ( Best > Copy )
            Best = Copy, Config = 7;
        // PXY
        // 101
        Copy = Abc_Tt6Flip( Copy, i );
        if ( Best > Copy )
            Best = Copy, Config = 5;
        // PXY
        // 100
        Copy = Abc_Tt6Flip( Copy, i+1 );
        if ( Best > Copy )
            Best = Copy, Config = 4;
        // PXY
        // 000
        Copy = Abc_Tt6SwapAdjacent( Copy, i );
        assert( Copy == pTruth[0] );
        assert( Best <= pTruth[0] );
        pTruth[0] = Best;
        return Config;
    }
}